

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase333::run(TestCase333 *this)

{
  bool bVar1;
  Type TVar2;
  bool local_951;
  undefined1 auStack_950 [7];
  bool _kj_shouldLog_11;
  Field local_940;
  Type local_900;
  Schema local_8f0;
  bool local_8e1;
  undefined1 auStack_8e0 [7];
  bool _kj_shouldLog_10;
  Field local_8d0;
  Type local_890;
  Schema local_880;
  StructSchema results;
  undefined1 auStack_870 [7];
  bool _kj_shouldLog_9;
  Field local_860;
  Type local_820;
  bool local_809;
  Schema SStack_808;
  bool _kj_shouldLog_8;
  bool local_7f9;
  undefined1 auStack_7f8 [7];
  bool _kj_shouldLog_7;
  Field local_7e8;
  undefined1 local_7a8 [8];
  Type boundFoo_1;
  Field local_788;
  Type local_748;
  Schema local_738;
  StructSchema bound_1;
  StructSchema inner2_1;
  undefined1 local_718 [8];
  Method method;
  Field local_6c8;
  Type local_688;
  Schema local_678;
  InterfaceSchema cap;
  undefined1 auStack_668 [7];
  bool _kj_shouldLog_6;
  Field local_658;
  undefined1 local_618 [8];
  Type unboundFoo;
  Field local_5f8;
  Type local_5b8;
  Schema local_5a8;
  StructSchema unbound;
  Schema SStack_598;
  bool _kj_shouldLog_5;
  bool local_589;
  undefined1 auStack_588 [7];
  bool _kj_shouldLog_4;
  Field local_578;
  undefined1 local_538 [8];
  Type boundFoo;
  Field local_518;
  Type local_4d8;
  Schema local_4c8;
  StructSchema bound;
  Field local_4b0;
  Type local_470;
  Schema local_460;
  StructSchema inner2;
  undefined1 auStack_450 [7];
  bool _kj_shouldLog_3;
  anon_union_8_2_eba6ea51_for_Type_5 local_448;
  Schema local_440;
  bool local_431;
  undefined1 auStack_430 [7];
  bool _kj_shouldLog_2;
  anon_union_8_2_eba6ea51_for_Type_5 local_428;
  Schema local_420;
  ArrayPtr<const_char> local_418;
  undefined1 local_408 [8];
  Field foo2;
  Field local_3b8;
  Type local_378;
  Schema local_368;
  StructSchema instance2;
  undefined1 auStack_358 [7];
  bool _kj_shouldLog_1;
  anon_union_8_2_eba6ea51_for_Type_5 local_350;
  Schema local_348;
  bool local_339;
  undefined1 auStack_338 [7];
  bool _kj_shouldLog;
  anon_union_8_2_eba6ea51_for_Type_5 local_330;
  Schema local_328;
  ArrayPtr<const_char> local_320;
  undefined1 local_310 [8];
  Field foo;
  ArrayPtr<const_char> local_2b8;
  undefined1 local_2a8 [8];
  Field basic;
  StructSchema branded;
  Reader local_258;
  Schema local_228;
  Schema local_220;
  StructSchema schema;
  Schema local_210;
  Reader local_208;
  RawBrandedSchema *local_1d8;
  Schema local_1d0;
  Reader local_1c8;
  RawBrandedSchema *local_198;
  Schema local_190;
  Reader local_188;
  RawBrandedSchema *local_158;
  Schema local_150;
  Reader local_148;
  RawBrandedSchema *local_118;
  Schema local_110;
  Reader local_108;
  Schema local_d8;
  Reader local_d0;
  Schema local_a0;
  Schema local_98;
  StructSchema tap;
  Schema local_80;
  Reader local_78;
  Schema local_48;
  Schema local_40;
  StructSchema allTypes;
  SchemaLoader loader;
  TestCase333 *this_local;
  
  SchemaLoader::SchemaLoader((SchemaLoader *)&allTypes);
  local_80.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  Schema::getProto(&local_78,&local_80);
  local_48 = SchemaLoader::load((SchemaLoader *)&allTypes,&local_78);
  local_40.raw = (RawBrandedSchema *)Schema::asStruct(&local_48);
  local_d8.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAnyPointer>();
  Schema::getProto(&local_d0,&local_d8);
  local_a0 = SchemaLoader::load((SchemaLoader *)&allTypes,&local_d0);
  local_98.raw = (RawBrandedSchema *)Schema::asStruct(&local_a0);
  local_110.raw =
       (RawBrandedSchema *)
       Schema::
       from<capnproto_test::capnp::test::TestGenerics<capnp::AnyPointer,capnp::AnyPointer>::Inner>()
  ;
  Schema::getProto(&local_108,&local_110);
  local_118 = (RawBrandedSchema *)SchemaLoader::load((SchemaLoader *)&allTypes,&local_108);
  local_150.raw =
       (RawBrandedSchema *)
       Schema::
       from<capnproto_test::capnp::test::TestGenerics<capnp::AnyPointer,capnp::AnyPointer>::Inner2<capnp::AnyPointer>>
                 ();
  Schema::getProto(&local_148,&local_150);
  local_158 = (RawBrandedSchema *)SchemaLoader::load((SchemaLoader *)&allTypes,&local_148);
  local_190.raw =
       (RawBrandedSchema *)
       Schema::
       from<capnproto_test::capnp::test::TestGenerics<capnp::AnyPointer,capnp::AnyPointer>::Interface<capnp::AnyPointer>>
                 ();
  Schema::getProto(&local_188,&local_190);
  local_198 = (RawBrandedSchema *)SchemaLoader::load((SchemaLoader *)&allTypes,&local_188);
  local_1d0.raw =
       (RawBrandedSchema *)
       Schema::
       from<capnproto_test::capnp::test::TestGenerics<capnp::AnyPointer,capnp::AnyPointer>::Interface<capnp::AnyPointer>::CallResults>
                 ();
  Schema::getProto(&local_1c8,&local_1d0);
  local_1d8 = (RawBrandedSchema *)SchemaLoader::load((SchemaLoader *)&allTypes,&local_1c8);
  local_210.raw =
       (RawBrandedSchema *)
       Schema::from<capnproto_test::capnp::test::TestGenerics<capnp::AnyPointer,capnp::AnyPointer>>
                 ();
  Schema::getProto(&local_208,&local_210);
  schema.super_Schema = SchemaLoader::load((SchemaLoader *)&allTypes,&local_208);
  branded.super_Schema.raw = (Schema)Schema::from<capnproto_test::capnp::test::TestUseGenerics>();
  Schema::getProto(&local_258,&branded.super_Schema);
  local_228 = SchemaLoader::load((SchemaLoader *)&allTypes,&local_258);
  local_220.raw = (RawBrandedSchema *)Schema::asStruct(&local_228);
  StructSchema::StructSchema((StructSchema *)&basic.proto._reader.nestingLimit);
  kj::StringPtr::StringPtr((StringPtr *)&local_2b8,"basic");
  StructSchema::getFieldByName((Field *)local_2a8,(StructSchema *)&local_220,(StringPtr)local_2b8);
  TVar2 = StructSchema::Field::getType((Field *)local_2a8);
  foo.proto._reader._40_8_ = TVar2._0_8_;
  basic.proto._reader._40_8_ = capnp::Type::asStruct((Type *)&foo.proto._reader.nestingLimit);
  kj::StringPtr::StringPtr((StringPtr *)&local_320,"foo");
  StructSchema::getFieldByName
            ((Field *)local_310,(StructSchema *)&basic.proto._reader.nestingLimit,
             (StringPtr)local_320);
  _auStack_338 = StructSchema::Field::getType((Field *)local_310);
  local_328.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)auStack_338);
  bVar1 = Schema::operator==(&local_328,&local_40);
  if (!bVar1) {
    local_339 = kj::_::Debug::shouldLog(ERROR);
    while (local_339 != false) {
      kj::_::Debug::log<char_const(&)[54]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x160,ERROR,"\"failed: expected \" \"foo.getType().asStruct() == allTypes\"",
                 (char (*) [54])"failed: expected foo.getType().asStruct() == allTypes");
      local_339 = false;
    }
  }
  _auStack_358 = StructSchema::Field::getType((Field *)local_310);
  local_348.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)auStack_358);
  bVar1 = Schema::operator!=(&local_348,&local_98);
  if (!bVar1) {
    instance2.super_Schema.raw._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)instance2.super_Schema.raw._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x161,ERROR,"\"failed: expected \" \"foo.getType().asStruct() != tap\"",
                 (char (*) [49])"failed: expected foo.getType().asStruct() != tap");
      instance2.super_Schema.raw._7_1_ = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&foo2.proto._reader.nestingLimit,"rev");
  StructSchema::getFieldByName
            (&local_3b8,(StructSchema *)&basic.proto._reader.nestingLimit,
             (StringPtr)stack0xfffffffffffffc38);
  local_378 = StructSchema::Field::getType(&local_3b8);
  local_368.raw = (RawBrandedSchema *)capnp::Type::asStruct(&local_378);
  kj::StringPtr::StringPtr((StringPtr *)&local_418,"foo");
  StructSchema::getFieldByName((Field *)local_408,(StructSchema *)&local_368,(StringPtr)local_418);
  _auStack_430 = StructSchema::Field::getType((Field *)local_408);
  local_420.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)auStack_430);
  bVar1 = Schema::operator==(&local_420,&local_98);
  if (!bVar1) {
    local_431 = kj::_::Debug::shouldLog(ERROR);
    while (local_431 != false) {
      kj::_::Debug::log<char_const(&)[50]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x165,ERROR,"\"failed: expected \" \"foo2.getType().asStruct() == tap\"",
                 (char (*) [50])"failed: expected foo2.getType().asStruct() == tap");
      local_431 = false;
    }
  }
  _auStack_450 = StructSchema::Field::getType((Field *)local_408);
  local_440.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)auStack_450);
  bVar1 = Schema::operator!=(&local_440,&local_40);
  if (!bVar1) {
    inner2.super_Schema.raw._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)inner2.super_Schema.raw._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x166,ERROR,"\"failed: expected \" \"foo2.getType().asStruct() != allTypes\"",
                 (char (*) [55])"failed: expected foo2.getType().asStruct() != allTypes");
      inner2.super_Schema.raw._7_1_ = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&bound,"inner2");
  StructSchema::getFieldByName(&local_4b0,(StructSchema *)&local_220,(StringPtr)_bound);
  local_470 = StructSchema::Field::getType(&local_4b0);
  local_460.raw = (RawBrandedSchema *)capnp::Type::asStruct(&local_470);
  kj::StringPtr::StringPtr((StringPtr *)&boundFoo.field_4,"innerBound");
  StructSchema::getFieldByName
            (&local_518,(StructSchema *)&local_460,(StringPtr)stack0xfffffffffffffad8);
  local_4d8 = StructSchema::Field::getType(&local_518);
  local_4c8.raw = (RawBrandedSchema *)capnp::Type::asStruct(&local_4d8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_588,"foo");
  StructSchema::getFieldByName(&local_578,(StructSchema *)&local_4c8,(StringPtr)_auStack_588);
  TVar2 = StructSchema::Field::getType(&local_578);
  boundFoo._0_8_ = TVar2.field_4;
  local_538 = TVar2._0_8_;
  bVar1 = capnp::Type::isAnyPointer((Type *)local_538);
  if (bVar1) {
    local_589 = kj::_::Debug::shouldLog(ERROR);
    while (local_589 != false) {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x16e,ERROR,"\"failed: expected \" \"!(boundFoo.isAnyPointer())\"",
                 (char (*) [44])"failed: expected !(boundFoo.isAnyPointer())");
      local_589 = false;
    }
  }
  SStack_598.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)local_538);
  bVar1 = Schema::operator==(&stack0xfffffffffffffa68,&local_40);
  if (!bVar1) {
    unbound.super_Schema.raw._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)unbound.super_Schema.raw._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x16f,ERROR,"\"failed: expected \" \"boundFoo.asStruct() == allTypes\"",
                 (char (*) [49])"failed: expected boundFoo.asStruct() == allTypes");
      unbound.super_Schema.raw._7_1_ = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&unboundFoo.field_4,"innerUnbound");
  StructSchema::getFieldByName
            (&local_5f8,(StructSchema *)&local_460,(StringPtr)stack0xfffffffffffff9f8);
  local_5b8 = StructSchema::Field::getType(&local_5f8);
  local_5a8.raw = (RawBrandedSchema *)capnp::Type::asStruct(&local_5b8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_668,"foo");
  StructSchema::getFieldByName(&local_658,(StructSchema *)&local_5a8,(StringPtr)_auStack_668);
  TVar2 = StructSchema::Field::getType(&local_658);
  unboundFoo._0_8_ = TVar2.field_4;
  local_618 = TVar2._0_8_;
  bVar1 = capnp::Type::isAnyPointer((Type *)local_618);
  if (!bVar1) {
    cap.super_Schema.raw._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)cap.super_Schema.raw._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x173,ERROR,"\"failed: expected \" \"unboundFoo.isAnyPointer()\"",
                 (char (*) [43])"failed: expected unboundFoo.isAnyPointer()");
      cap.super_Schema.raw._7_1_ = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&method.proto._reader.nestingLimit,"genericCap");
  StructSchema::getFieldByName
            (&local_6c8,(StructSchema *)&local_220,(StringPtr)stack0xfffffffffffff928);
  local_688 = StructSchema::Field::getType(&local_6c8);
  local_678.raw = (RawBrandedSchema *)capnp::Type::asInterface(&local_688);
  kj::StringPtr::StringPtr((StringPtr *)&inner2_1,"call");
  InterfaceSchema::getMethodByName
            ((Method *)local_718,(InterfaceSchema *)&local_678,(StringPtr)_inner2_1);
  bound_1 = InterfaceSchema::Method::getParamType((Method *)local_718);
  kj::StringPtr::StringPtr((StringPtr *)&boundFoo_1.field_4,"innerBound");
  StructSchema::getFieldByName(&local_788,&bound_1,(StringPtr)stack0xfffffffffffff868);
  local_748 = StructSchema::Field::getType(&local_788);
  local_738.raw = (RawBrandedSchema *)capnp::Type::asStruct(&local_748);
  kj::StringPtr::StringPtr((StringPtr *)auStack_7f8,"foo");
  StructSchema::getFieldByName(&local_7e8,(StructSchema *)&local_738,(StringPtr)_auStack_7f8);
  TVar2 = StructSchema::Field::getType(&local_7e8);
  boundFoo_1._0_8_ = TVar2.field_4;
  local_7a8 = TVar2._0_8_;
  bVar1 = capnp::Type::isAnyPointer((Type *)local_7a8);
  if (bVar1) {
    local_7f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7f9 != false) {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x17d,ERROR,"\"failed: expected \" \"!(boundFoo.isAnyPointer())\"",
                 (char (*) [44])"failed: expected !(boundFoo.isAnyPointer())");
      local_7f9 = false;
    }
  }
  SStack_808.raw = (RawBrandedSchema *)capnp::Type::asStruct((Type *)local_7a8);
  bVar1 = Schema::operator==(&stack0xfffffffffffff7f8,&local_40);
  if (!bVar1) {
    local_809 = kj::_::Debug::shouldLog(ERROR);
    while (local_809 != false) {
      kj::_::Debug::log<char_const(&)[49]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x17e,ERROR,"\"failed: expected \" \"boundFoo.asStruct() == allTypes\"",
                 (char (*) [49])"failed: expected boundFoo.asStruct() == allTypes");
      local_809 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_870,"baz");
  StructSchema::getFieldByName(&local_860,&bound_1,(StringPtr)_auStack_870);
  local_820 = StructSchema::Field::getType(&local_860);
  bVar1 = capnp::Type::isText(&local_820);
  if (!bVar1) {
    results.super_Schema.raw._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)results.super_Schema.raw._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x17f,ERROR,
                 "\"failed: expected \" \"inner2.getFieldByName(\\\"baz\\\").getType().isText()\"",
                 (char (*) [65])"failed: expected inner2.getFieldByName(\"baz\").getType().isText()"
                );
      results.super_Schema.raw._7_1_ = false;
    }
  }
  local_880.raw = (RawBrandedSchema *)InterfaceSchema::Method::getResultType((Method *)local_718);
  kj::StringPtr::StringPtr((StringPtr *)auStack_8e0,"qux");
  StructSchema::getFieldByName(&local_8d0,(StructSchema *)&local_880,(StringPtr)_auStack_8e0);
  local_890 = StructSchema::Field::getType(&local_8d0);
  bVar1 = capnp::Type::isData(&local_890);
  if (!bVar1) {
    local_8e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8e1 != false) {
      kj::_::Debug::log<char_const(&)[66]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x182,ERROR,
                 "\"failed: expected \" \"results.getFieldByName(\\\"qux\\\").getType().isData()\"",
                 (char (*) [66])
                 "failed: expected results.getFieldByName(\"qux\").getType().isData()");
      local_8e1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_950,"gen");
  StructSchema::getFieldByName(&local_940,(StructSchema *)&local_880,(StringPtr)_auStack_950);
  local_900 = StructSchema::Field::getType(&local_940);
  local_8f0.raw = (RawBrandedSchema *)capnp::Type::asStruct(&local_900);
  bVar1 = Schema::operator==(&local_8f0,(Schema *)&basic.proto._reader.nestingLimit);
  if (!bVar1) {
    local_951 = kj::_::Debug::shouldLog(ERROR);
    while (local_951 != false) {
      kj::_::Debug::log<char_const(&)[79]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x184,ERROR,
                 "\"failed: expected \" \"results.getFieldByName(\\\"gen\\\").getType().asStruct() == branded\""
                 ,(char (*) [79])
                  "failed: expected results.getFieldByName(\"gen\").getType().asStruct() == branded"
                );
      local_951 = false;
    }
  }
  SchemaLoader::~SchemaLoader((SchemaLoader *)&allTypes);
  return;
}

Assistant:

TEST(SchemaLoader, Generics) {
  SchemaLoader loader;

  StructSchema allTypes = loader.load(Schema::from<TestAllTypes>().getProto()).asStruct();
  StructSchema tap = loader.load(Schema::from<test::TestAnyPointer>().getProto()).asStruct();
  loader.load(Schema::from<test::TestGenerics<>::Inner>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Inner2<>>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Interface<>>().getProto());
  loader.load(Schema::from<test::TestGenerics<>::Interface<>::CallResults>().getProto());
  loader.load(Schema::from<test::TestGenerics<>>().getProto());
  StructSchema schema = loader.load(Schema::from<test::TestUseGenerics>().getProto()).asStruct();

  StructSchema branded;

  {
    StructSchema::Field basic = schema.getFieldByName("basic");
    branded = basic.getType().asStruct();

    StructSchema::Field foo = branded.getFieldByName("foo");
    EXPECT_TRUE(foo.getType().asStruct() == allTypes);
    EXPECT_TRUE(foo.getType().asStruct() != tap);

    StructSchema instance2 = branded.getFieldByName("rev").getType().asStruct();
    StructSchema::Field foo2 = instance2.getFieldByName("foo");
    EXPECT_TRUE(foo2.getType().asStruct() == tap);
    EXPECT_TRUE(foo2.getType().asStruct() != allTypes);
  }

  {
    StructSchema inner2 = schema.getFieldByName("inner2").getType().asStruct();

    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);

    StructSchema unbound = inner2.getFieldByName("innerUnbound").getType().asStruct();
    Type unboundFoo = unbound.getFieldByName("foo").getType();
    EXPECT_TRUE(unboundFoo.isAnyPointer());
  }

  {
    InterfaceSchema cap = schema.getFieldByName("genericCap").getType().asInterface();
    InterfaceSchema::Method method = cap.getMethodByName("call");

    StructSchema inner2 = method.getParamType();
    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);
    EXPECT_TRUE(inner2.getFieldByName("baz").getType().isText());

    StructSchema results = method.getResultType();
    EXPECT_TRUE(results.getFieldByName("qux").getType().isData());

    EXPECT_TRUE(results.getFieldByName("gen").getType().asStruct() == branded);
  }
}